

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  allocator<int> *this_00;
  allocator<tcu::Vector<float,_4>_> *paVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  GLuint GVar7;
  size_type sVar8;
  reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  reference pixels;
  byte *pbVar13;
  uint *puVar14;
  float *data_12;
  Matrix<float,_4,_4> *mat;
  CallLogWrapper *pCVar15;
  float *local_5d8;
  Matrix<float,_4,_4> *local_578;
  undefined1 local_3b8 [8];
  GLuint data_11 [4];
  Vector<float,_3> local_3a0;
  Matrix<float,_4,_4> local_394;
  Matrix<float,_4,_4> local_354;
  Vector<float,_3> local_314;
  Matrix<float,_4,_4> local_308;
  undefined1 local_2c8 [8];
  mat4 data_10 [2];
  int local_240;
  allocator<int> local_239;
  int i_5;
  vector<int,_std::allocator<int>_> data_9;
  uint local_218;
  GLuint i_4;
  GLuint data_8 [8];
  ulong local_1f0;
  size_t i_3;
  undefined1 local_1e0 [8];
  vector<int,_std::allocator<int>_> data_7;
  Vector<float,_4> local_1c0;
  ulong local_1b0;
  size_t i_2;
  float local_1a0 [2];
  int local_198;
  allocator<unsigned_char> local_191;
  int i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  undefined1 local_170 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_6;
  Vector<float,_4> local_150;
  undefined1 local_140 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_5;
  GLuint data_4 [4];
  allocator<tcu::Matrix<float,_4,_4>_> local_d1;
  undefined1 local_d0 [8];
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_3;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> data_2;
  GLuint data_1 [8];
  allocator<int> local_69;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> data;
  string local_40;
  int local_1c;
  AdvancedPipelineComputeChain *pAStack_18;
  int i;
  AdvancedPipelineComputeChain *this_local;
  
  pAStack_18 = this;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    gl4cts::(anonymous_namespace)::AdvancedPipelineComputeChain::GenGLSL_abi_cxx11_
              (&local_40,this,local_1c);
    GVar7 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
    this->m_program[local_1c] = GVar7;
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[local_1c]);
    bVar6 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[local_1c],(bool *)0x0);
    if (!bVar6) {
      this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,4,this->m_storage_buffer);
  std::allocator<int>::allocator(&local_69);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,0x205,&local_69);
  std::allocator<int>::~allocator(&local_69);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,this->m_storage_buffer[0]);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_68);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_68,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 2,pvVar9,0x88e6);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  data_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar15 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(pCVar15,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData
            (pCVar15,0x90d2,0x20,
             &data_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,0x88e6);
  data_3.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
  this_00 = (allocator<int> *)
            ((long)&data_3.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,0x200,
             (value_type_conflict1 *)
             ((long)&data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer[2]);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b0);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 2,pvVar9,0x88e6);
  GVar7 = this->m_storage_buffer[2];
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b0);
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,2,GVar7,0,sVar8 * 2 & 0x7ffffffffffffffe);
  GVar7 = this->m_storage_buffer[2];
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b0);
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_b0);
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,3,GVar7,sVar8 * 2 & 0x7ffffffffffffffe,sVar10 * 2 & 0x7ffffffffffffffe);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  std::allocator<tcu::Matrix<float,_4,_4>_>::allocator(&local_d1);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             local_d0,2,&local_d1);
  std::allocator<tcu::Matrix<float,_4,_4>_>::~allocator(&local_d1);
  data_4[2] = 0x3f800000;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(data_4 + 3),(float *)(data_4 + 2));
  pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
            operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        *)local_d0,0);
  tcu::Matrix<float,_4,_4>::operator=(pvVar11,(Matrix<float,_4,_4> *)(data_4 + 3));
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(data_4 + 3));
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,4,this->m_storage_buffer[3]);
  sVar8 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::size
                    ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *
                     )local_d0);
  pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
            operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        *)local_d0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,sVar8 << 6,pvVar11,0x88e6);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::~vector
            ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             local_d0);
  data_5.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_4[0] = 0;
  data_4[1] = 0;
  pCVar15 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(pCVar15,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(pCVar15,0x92c0,1,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar15,0x92c0,0x10,
             &data_5.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x88e6);
  tcu::Vector<float,_4>::Vector(&local_150,0.0);
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&data_6.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140,
             0x10,&local_150,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&data_6.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_texture);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2800,0x2600);
  pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_140,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x8814,4,4,0,0x1908,0x1406,pvVar12);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140);
  pCVar15 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(pCVar15,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(pCVar15,0,this->m_texture,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glDispatchCompute(pCVar15,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(pCVar15,0x2020);
  glu::CallLogWrapper::glDispatchCompute(pCVar15,3,2,2);
  glu::CallLogWrapper::glUseProgram(pCVar15,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(pCVar15,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(pCVar15,800);
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_170,
             0x10,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,this->m_texture);
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x8d40,0x8ce0,0xde1,this->m_texture,0);
  std::allocator<unsigned_char>::allocator(&local_191);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,0x40,&local_191);
  std::allocator<unsigned_char>::~allocator(&local_191);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,0,4,4,0x1908,0x1401,pixels);
  for (local_198 = 0; local_198 < 0x40; local_198 = local_198 + 4) {
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                         (long)local_198);
    bVar2 = *pbVar13;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                         (long)(local_198 + 1));
    bVar3 = *pbVar13;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                         (long)(local_198 + 2));
    bVar4 = *pbVar13;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                         (long)(local_198 + 3));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&i_2,(float)bVar2 / 255.0,(float)bVar3 / 255.0,
               (float)bVar4 / 255.0,(float)*pbVar13 / 255.0);
    pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_170,(long)(local_198 / 4));
    *(size_t *)pvVar12->m_data = i_2;
    *(float (*) [2])(pvVar12->m_data + 2) = local_1a0;
  }
  for (local_1b0 = 0; uVar5 = local_1b0,
      sVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_170), uVar5 < sVar8; local_1b0 = local_1b0 + 1) {
    pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_170,local_1b0);
    tcu::Vector<float,_4>::Vector(&local_1c0,0.25,0.5,0.75,1.0);
    bVar6 = ComputeShaderBase::ColorEqual
                      (&this->super_ComputeShaderBase,pvVar12,&local_1c0,
                       &(this->super_ComputeShaderBase).g_color_eps);
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      anon_unknown_0::Output("Invalid data at texture.\n");
      this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
      data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_00f6d598;
    }
  }
  data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
LAB_00f6d598:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_170);
  if (data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    std::allocator<int>::allocator((allocator<int> *)((long)&i_3 + 7));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1e0,0x205,
               (allocator<int> *)((long)&i_3 + 7));
    std::allocator<int>::~allocator((allocator<int> *)((long)&i_3 + 7));
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer[0]);
    sVar8 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_1e0);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1e0,0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,sVar8 << 2,pvVar9);
    for (local_1f0 = 5;
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_1e0), local_1f0 < sVar8;
        local_1f0 = local_1f0 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1e0,local_1f0);
      if (*pvVar9 != 4) {
        puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_1e0,local_1f0);
        anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)*puVar14,2);
        this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
        data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        goto LAB_00f6d782;
      }
    }
    data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
LAB_00f6d782:
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1e0);
    if (data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == 0) {
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0x20,&local_218);
      for (data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ = 0;
          data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 4;
          data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ + 1) {
        if ((&local_218)
            [data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_] !=
            data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_) {
          anon_unknown_0::Output
                    ("Data is: %d should be: %d.\n",
                     (ulong)(&local_218)
                            [data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_],
                     (ulong)data_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
          this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
          return (long)this_local;
        }
      }
      std::allocator<int>::allocator(&local_239);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i_5,0x200,&local_239);
      std::allocator<int>::~allocator(&local_239);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[2]);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&i_5);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_5,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,sVar8 << 2,pvVar9);
      for (local_240 = 0; local_240 < 2; local_240 = local_240 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_5,(long)local_240);
        if (*pvVar9 != 5) {
          puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_5,(long)local_240);
          anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)*puVar14,5);
          this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
          data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
          goto LAB_00f6da37;
        }
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_5,(long)(local_240 + 0x100));
        if (*pvVar9 != 7) {
          puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_5,
                                       (long)(local_240 + 0x100));
          anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)*puVar14,7);
          this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
          data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
          goto LAB_00f6da37;
        }
      }
      data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
LAB_00f6da37:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_5);
      if (data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ == 0) {
        local_578 = (Matrix<float,_4,_4> *)local_2c8;
        do {
          tcu::Matrix<float,_4,_4>::Matrix(local_578);
          local_578 = local_578 + 1;
        } while (local_578 != (Matrix<float,_4,_4> *)(data_10[1].m_data.m_data[3].m_data + 2));
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,this->m_storage_buffer[3]);
        data_12 = tcu::Matrix<float,_4,_4>::operator()((Matrix<float,_4,_4> *)local_2c8,0,0);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,0x80,data_12);
        tcu::Vector<float,_3>::Vector(&local_314,10.0,20.0,30.0);
        tcu::translationMatrix<float,_3>(&local_308,&local_314);
        bVar6 = tcu::operator!=((Matrix<float,_4,_4> *)local_2c8,&local_308);
        tcu::Matrix<float,_4,_4>::~Matrix(&local_308);
        if (bVar6) {
          anon_unknown_0::Output("Data is incorrect.\n");
          this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
          data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
        }
        else {
          tcu::Vector<float,_3>::Vector(&local_3a0,10.0,20.0,30.0);
          tcu::translationMatrix<float,_3>(&local_394,&local_3a0);
          tcu::transpose<float,4,4>(&local_354,(tcu *)&local_394,mat);
          bVar6 = tcu::operator!=((Matrix<float,_4,_4> *)(data_10[0].m_data.m_data[3].m_data + 2),
                                  &local_354);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_354);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_394);
          if (bVar6) {
            anon_unknown_0::Output("Data is incorrect.\n");
            this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
            data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = 1;
          }
          else {
            data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = 0;
          }
        }
        local_5d8 = data_10[1].m_data.m_data[3].m_data + 2;
        do {
          local_5d8 = local_5d8 + -0x10;
          tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_5d8);
        } while (local_5d8 != (float *)local_2c8);
        if (data_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ == 0) {
          memset(local_3b8,0,0x10);
          glu::CallLogWrapper::glGetBufferSubData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x92c0,0,0x10,local_3b8);
          if (data_11[1] == 4) {
            this_local = (AdvancedPipelineComputeChain *)0x0;
          }
          else {
            anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)data_11[1],4);
            this_local = (AdvancedPipelineComputeChain *)&DAT_ffffffffffffffff;
          }
        }
      }
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<vec4> data(4 * 4, vec4(0.0f));
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), g_color_eps))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}
		/* validate storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(data.size() * sizeof(int)), &data[0]);
			for (std::size_t i = 5; i < data.size(); ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 1 */
		{
			GLuint data[8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(GLint) * data.size()), &data[0]);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					return ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 4 */
		{
			mat4 data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0](0, 0));
			if (data[0] != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
			if (data[1] != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
		}
		/* validate counter buffer */
		{
			GLuint data[4] = { 0 };
			glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				return ERROR;
			}
		}

		return NO_ERROR;
	}